

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

int bloaty::SignOf(long val)

{
  long val_local;
  undefined4 local_4;
  
  if (val < 0) {
    local_4 = -1;
  }
  else if (val < 1) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int SignOf(long val) {
  if (val < 0) {
    return -1;
  } else if (val > 0) {
    return 1;
  } else {
    return 0;
  }
}